

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iouring-pollhup.c
# Opt level: O0

void read_data2(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_buf_t *buf_local;
  ssize_t nread_local;
  uv_stream_t *stream_local;
  
  if (nread < 0) {
    if (nread != -0xfff) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-iouring-pollhup.c"
              ,0x35,"nread","==","UV_EOF",nread,"==",0xfffffffffffff001);
      abort();
    }
    iVar1 = close(duped_fd);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-iouring-pollhup.c"
              ,0x36,"close(duped_fd)","==","0",(long)iVar1,"==",0);
      abort();
    }
    duped_fd = -1;
    uv_close(&p2,0);
    uv_close(&idle_handle,0);
  }
  else if (nread < 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-iouring-pollhup.c"
            ,0x3f,"nread",">","0",nread,">",0);
    abort();
  }
  return;
}

Assistant:

static void read_data2(uv_stream_t* stream,
                       ssize_t nread,
                       const uv_buf_t* buf) {
  if (nread < 0) {
    ASSERT_EQ(nread, UV_EOF);
    ASSERT_OK(close(duped_fd));
    duped_fd = -1;
    uv_close((uv_handle_t*) &p2, NULL);
    uv_close((uv_handle_t*) &idle_handle, NULL);
  } else {
    /* If nread == 0 is because of POLLHUP received still from pipefds[0] file
     * description which is still referenced in duped_fd. It should not happen
     * if close(p1) was called after EPOLL_CTL_DEL.
     */
    ASSERT_GT(nread, 0);
  }
}